

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O0

wchar_t assertion_file_exists(char *filename,wchar_t line,char *f)

{
  int iVar1;
  char *f_local;
  wchar_t line_local;
  char *filename_local;
  
  assertion_count(filename,line);
  iVar1 = access(f,0);
  if (iVar1 != 0) {
    failure_start(filename,line,"File should exist: %s",f);
    failure_finish((void *)0x0);
  }
  filename_local._4_4_ = (wchar_t)(iVar1 == 0);
  return filename_local._4_4_;
}

Assistant:

int
assertion_file_exists(const char *filename, int line, const char *f)
{
	assertion_count(filename, line);

#if defined(_WIN32) && !defined(__CYGWIN__)
	if (!_access(f, 0))
		return (1);
#else
	if (!access(f, F_OK))
		return (1);
#endif
	failure_start(filename, line, "File should exist: %s", f);
	failure_finish(NULL);
	return (0);
}